

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int setDecodeDefaults(jpeg_decompress_struct *dinfo,int pixelFormat,int subsamp,int flags)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  J_COLOR_SPACE JVar4;
  JQUANT_TBL *pJVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  undefined8 uVar9;
  
  dinfo->scale_num = 1;
  dinfo->scale_denom = 1;
  JVar4 = (pixelFormat != 3) + 1 + (uint)(pixelFormat != 3);
  dinfo->comps_in_scan = JVar4;
  dinfo->num_components = JVar4;
  dinfo->jpeg_color_space = JVar4;
  pJVar5 = (JQUANT_TBL *)(*dinfo->mem->alloc_small)((j_common_ptr)dinfo,1,(long)JVar4 * 0x60);
  dinfo->comp_info = (jpeg_component_info *)pJVar5;
  iVar2 = dinfo->num_components;
  if (0 < (long)iVar2) {
    lVar8 = 0;
    do {
      uVar9 = 0x100000001;
      if (lVar8 == 0) {
        uVar9 = CONCAT44((int)(((uint)(tjMCUHeight[pixelFormat] >> 0x1f) >> 0x1d) +
                              tjMCUHeight[pixelFormat]) >> 3,
                         (int)(((uint)(tjMCUWidth[pixelFormat] >> 0x1f) >> 0x1d) +
                              tjMCUWidth[pixelFormat]) >> 3);
      }
      *(undefined8 *)(pJVar5->quantval + 4) = uVar9;
      *(int *)(pJVar5->quantval + 2) = (int)lVar8;
      lVar1 = lVar8 + 1;
      *(int *)pJVar5->quantval = (int)lVar1;
      uVar7 = (uint)(lVar8 != 0);
      *(uint *)(pJVar5->quantval + 0xc) = uVar7;
      *(uint *)(pJVar5->quantval + 10) = uVar7;
      *(uint *)(pJVar5->quantval + 8) = uVar7;
      dinfo->cur_comp_info[lVar8] = (jpeg_component_info *)pJVar5;
      pJVar5 = (JQUANT_TBL *)(pJVar5->quantval + 0x30);
      lVar8 = lVar1;
    } while (iVar2 != lVar1);
  }
  dinfo->data_precision = 8;
  lVar8 = 0;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    if (dinfo->quant_tbl_ptrs[lVar8] == (JQUANT_TBL *)0x0) {
      pJVar5 = jpeg_alloc_quant_table((j_common_ptr)dinfo);
      dinfo->quant_tbl_ptrs[lVar8] = pJVar5;
    }
    lVar8 = 1;
    bVar3 = false;
  } while (bVar6);
  return (int)pJVar5;
}

Assistant:

static int setDecodeDefaults(struct jpeg_decompress_struct *dinfo,
                             int pixelFormat, int subsamp, int flags)
{
  int i;

  dinfo->scale_num = dinfo->scale_denom = 1;

  if (subsamp == TJSAMP_GRAY) {
    dinfo->num_components = dinfo->comps_in_scan = 1;
    dinfo->jpeg_color_space = JCS_GRAYSCALE;
  } else {
    dinfo->num_components = dinfo->comps_in_scan = 3;
    dinfo->jpeg_color_space = JCS_YCbCr;
  }

  dinfo->comp_info = (jpeg_component_info *)
    (*dinfo->mem->alloc_small) ((j_common_ptr)dinfo, JPOOL_IMAGE,
                                dinfo->num_components *
                                sizeof(jpeg_component_info));

  for (i = 0; i < dinfo->num_components; i++) {
    jpeg_component_info *compptr = &dinfo->comp_info[i];

    compptr->h_samp_factor = (i == 0) ? tjMCUWidth[subsamp] / 8 : 1;
    compptr->v_samp_factor = (i == 0) ? tjMCUHeight[subsamp] / 8 : 1;
    compptr->component_index = i;
    compptr->component_id = i + 1;
    compptr->quant_tbl_no = compptr->dc_tbl_no =
      compptr->ac_tbl_no = (i == 0) ? 0 : 1;
    dinfo->cur_comp_info[i] = compptr;
  }
  dinfo->data_precision = 8;
  for (i = 0; i < 2; i++) {
    if (dinfo->quant_tbl_ptrs[i] == NULL)
      dinfo->quant_tbl_ptrs[i] = jpeg_alloc_quant_table((j_common_ptr)dinfo);
  }

  return 0;
}